

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall
argparse::ArgumentParser::parse_args
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  Argument *this_00;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pMVar5;
  runtime_error *prVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  Argument *this_01;
  undefined8 *puVar10;
  long lVar11;
  string argument_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  parse_args_internal(this,arguments);
  for (p_Var4 = (this->m_argument_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->m_argument_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    Argument::validate((Argument *)&(p_Var4[1]._M_left)->_M_left);
  }
  pMVar5 = (this->m_mutually_exclusive_groups).
           super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pMVar5 == (this->m_mutually_exclusive_groups).
                  super__Vector_base<argparse::ArgumentParser::MutuallyExclusiveGroup,_std::allocator<argparse::ArgumentParser::MutuallyExclusiveGroup>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    puVar10 = *(undefined8 **)(pMVar5 + 0x10);
    puVar2 = *(undefined8 **)(pMVar5 + 0x18);
    if (puVar10 == puVar2) {
LAB_0011ca08:
      if (pMVar5[8] == (MutuallyExclusiveGroup)0x1) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_allocated_capacity =
             local_90.field_2._M_allocated_capacity & 0xffffffffffffff00;
        puVar10 = *(undefined8 **)(pMVar5 + 0x10);
        if ((long)puVar2 - (long)puVar10 != 0) {
          lVar11 = (long)puVar2 - (long)puVar10 >> 3;
          paVar8 = &local_f0.field_2;
          paVar1 = &local_d0.field_2;
          do {
            lVar11 = lVar11 + -1;
            if (lVar11 == 0) {
              Argument::get_usage_full_abi_cxx11_(&local_b0,(Argument *)*puVar10);
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_b0,0,0,"\'",1);
              local_f0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p == paVar9) {
                local_f0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_f0._M_dataplus._M_p = (pointer)paVar8;
              }
              else {
                local_f0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_f0._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_f0,"\' ");
              local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p == paVar9) {
                local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_d0._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_d0._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_90,local_d0._M_dataplus._M_p,local_d0._M_string_length);
            }
            else {
              Argument::get_usage_full_abi_cxx11_(&local_b0,(Argument *)*puVar10);
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                 (&local_b0,0,0,"\'",1);
              local_f0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p == paVar9) {
                local_f0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_f0._M_dataplus._M_p = (pointer)paVar8;
              }
              else {
                local_f0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_f0._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              pbVar7 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_f0,"\' or ");
              local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
              paVar9 = &pbVar7->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p == paVar9) {
                local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
                local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
                local_d0._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
              }
              local_d0._M_string_length = pbVar7->_M_string_length;
              (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
              pbVar7->_M_string_length = 0;
              (pbVar7->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_90,local_d0._M_dataplus._M_p,local_d0._M_string_length);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != paVar8) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 != puVar2);
        }
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_f0,"One of the arguments ",&local_90);
        pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_f0,"is required");
        local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
        paVar8 = &pbVar7->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == paVar8) {
          local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        }
        local_d0._M_string_length = pbVar7->_M_string_length;
        (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
        pbVar7->_M_string_length = 0;
        (pbVar7->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(prVar6,(string *)&local_d0);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      bVar3 = false;
      this_01 = (Argument *)0x0;
      do {
        this_00 = (Argument *)*puVar10;
        if (bVar3) {
          if ((this_00->field_0x140 & 0x10) != 0) {
            prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
            Argument::get_usage_full_abi_cxx11_(&local_70,this_00);
            std::operator+(&local_b0,"Argument \'",&local_70);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_b0,"\' not allowed with \'");
            local_f0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p == paVar8) {
              local_f0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            }
            else {
              local_f0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_f0._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            Argument::get_usage_full_abi_cxx11_(&local_50,this_01);
            std::operator+(&local_d0,&local_f0,&local_50);
            pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_d0,"\'");
            local_90._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
            paVar8 = &pbVar7->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p == paVar8) {
              local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
              local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            }
            else {
              local_90.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
            }
            local_90._M_string_length = pbVar7->_M_string_length;
            (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
            pbVar7->_M_string_length = 0;
            (pbVar7->field_2)._M_local_buf[0] = '\0';
            std::runtime_error::runtime_error(prVar6,(string *)&local_90);
            __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else if ((this_00->field_0x140 & 0x10) != 0) {
          bVar3 = true;
          this_01 = this_00;
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != puVar2);
      if (!bVar3) goto LAB_0011ca08;
    }
    pMVar5 = pMVar5 + 0x28;
  } while( true );
}

Assistant:

void parse_args(const std::vector<std::string> &arguments) {
    parse_args_internal(arguments);
    // Check if all arguments are parsed
    for ([[maybe_unused]] const auto &[unused, argument] : m_argument_map) {
      argument->validate();
    }

    // Check each mutually exclusive group and make sure
    // there are no constraint violations
    for (const auto &group : m_mutually_exclusive_groups) {
      auto mutex_argument_used{false};
      Argument *mutex_argument_it{nullptr};
      for (Argument *arg : group.m_elements) {
        if (!mutex_argument_used && arg->m_is_used) {
          mutex_argument_used = true;
          mutex_argument_it = arg;
        } else if (mutex_argument_used && arg->m_is_used) {
          // Violation
          throw std::runtime_error("Argument '" + arg->get_usage_full() +
                                   "' not allowed with '" +
                                   mutex_argument_it->get_usage_full() + "'");
        }
      }

      if (!mutex_argument_used && group.m_required) {
        // at least one argument from the group is
        // required
        std::string argument_names{};
        std::size_t i = 0;
        std::size_t size = group.m_elements.size();
        for (Argument *arg : group.m_elements) {
          if (i + 1 == size) {
            // last
            argument_names += "'" + arg->get_usage_full() + "' ";
          } else {
            argument_names += "'" + arg->get_usage_full() + "' or ";
          }
          i += 1;
        }
        throw std::runtime_error("One of the arguments " + argument_names +
                                 "is required");
      }
    }
  }